

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O2

void add_test_to_context(TestSuite *parent,ContextSuite **context_suites,TestItem *test_item,
                        CgreenTest *test)

{
  ContextSuite *suites;
  char *context_name;
  TestSuite *pTVar1;
  ContextSuite *pCVar2;
  char *pcVar3;
  
  suites = *context_suites;
  context_name = test_item->context_name;
  pTVar1 = find_suite_for_context(suites,context_name);
  if (pTVar1 == (TestSuite *)0x0) {
    pCVar2 = (ContextSuite *)calloc(1,0x18);
    pcVar3 = (char *)string_dup(context_name);
    pCVar2->context_name = pcVar3;
    pTVar1 = (TestSuite *)
             create_named_test_suite_
                       (context_name,
                        "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tools/runner.c"
                        ,0x6d);
    pCVar2->suite = pTVar1;
    pCVar2->next = suites;
    add_suite_(parent,context_name,pTVar1);
    *context_suites = pCVar2;
  }
  add_test_(pTVar1,test_item->test_name,test);
  return;
}

Assistant:

static void add_test_to_context(TestSuite *parent, ContextSuite **context_suites,
                                TestItem *test_item, CgreenTest *test) {
    TestSuite *suite_for_context = find_suite_for_context(*context_suites, test_item->context_name);

    if (suite_for_context == NULL) {
        *context_suites = add_new_context_suite(parent, test_item->context_name, *context_suites);
        suite_for_context = (*context_suites)->suite;
    }
    add_test_(suite_for_context, test_item->test_name, test);
}